

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O2

char * match(MatchState *ms,char *s,char *p)

{
  byte bVar1;
  char cVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  byte *pbVar6;
  ulong uVar7;
  ptrdiff_t *ppVar8;
  char *pcVar9;
  char *p_00;
  byte *s_00;
  bool bVar10;
  
  iVar4 = ms->depth;
  ms->depth = iVar4 + 1;
  if (199 < iVar4) {
    lj_err_caller(ms->L,LJ_ERR_STRPATX);
  }
LAB_0011e0a1:
  s_00 = (byte *)s + 1;
  pcVar9 = p;
LAB_0011e0a8:
  switch(*pcVar9) {
  case '$':
    if (pcVar9[1] == '\0') {
      pbVar6 = (byte *)0x0;
      if (s == ms->src_end) {
        pbVar6 = (byte *)s;
      }
      goto LAB_0011e354;
    }
    break;
  case '%':
    bVar1 = pcVar9[1];
    if ((ulong)bVar1 == 0x66) goto code_r0x0011e0d5;
    if (bVar1 == 0x62) {
      bVar1 = pcVar9[2];
      if ((bVar1 == 0) || (pcVar9[3] == 0)) {
        lj_err_caller(ms->L,LJ_ERR_STRPATU);
      }
      if (*s != bVar1) goto LAB_0011e337;
      iVar4 = 1;
      goto LAB_0011e1ef;
    }
    if ((""[(ulong)bVar1 + 1] & 8) == 0) break;
    if ((0x30 < bVar1) && (uVar5 = bVar1 - 0x31, (int)uVar5 < ms->level)) {
      uVar7 = ms->capture[uVar5].len;
      if (uVar7 != 0xffffffffffffffff) {
        if (((ulong)((long)ms->src_end - (long)s) < uVar7) ||
           (iVar4 = bcmp(ms->capture[uVar5].init,s,uVar7), iVar4 != 0)) goto LAB_0011e337;
        pbVar6 = (byte *)0x0;
        if ((byte *)s == (byte *)0x0) goto LAB_0011e354;
        s = (char *)((byte *)s + uVar7);
        p = pcVar9 + 2;
        goto LAB_0011e0a1;
      }
    }
    lj_err_caller(ms->L,LJ_ERR_STRCAPI);
  case '&':
  case '\'':
    break;
  case '(':
    if (pcVar9[1] == ')') {
      pcVar9 = pcVar9 + 2;
      iVar4 = -2;
    }
    else {
      pcVar9 = pcVar9 + 1;
      iVar4 = -1;
    }
    pbVar6 = (byte *)start_capture(ms,s,pcVar9,iVar4);
    goto LAB_0011e354;
  case ')':
    uVar7 = (ulong)(uint)ms->level;
    ppVar8 = &ms->capture[uVar7 - 1].len;
    do {
      if ((int)uVar7 < 1) {
        lj_err_caller(ms->L,LJ_ERR_STRPATC);
      }
      uVar7 = uVar7 - 1;
      lVar3 = *ppVar8;
      ppVar8 = ppVar8 + -2;
    } while (lVar3 != -1);
    uVar7 = uVar7 & 0xffffffff;
    ms->capture[uVar7].len = (long)s - (long)ms->capture[uVar7].init;
    pbVar6 = (byte *)match(ms,s,pcVar9 + 1);
    if (pbVar6 != (byte *)0x0) goto LAB_0011e354;
    ms->capture[uVar7].len = -1;
    goto LAB_0011e337;
  default:
    pbVar6 = (byte *)s;
    if (*pcVar9 == '\0') goto LAB_0011e354;
  }
  p = classend(ms,pcVar9);
  if (s < ms->src_end) {
    iVar4 = singlematch((uint)(byte)*s,pcVar9,p);
    bVar10 = iVar4 != 0;
  }
  else {
    bVar10 = false;
  }
  cVar2 = *p;
  if (cVar2 == '?') {
    if ((bVar10) && (pbVar6 = (byte *)match(ms,(char *)s_00,p + 1), pbVar6 != (byte *)0x0))
    goto LAB_0011e354;
    pcVar9 = p + 1;
    goto LAB_0011e0a8;
  }
  if (cVar2 != '*') {
    if (cVar2 != '+') {
      if (cVar2 == '-') {
        goto LAB_0011e386;
      }
      if (!bVar10) goto LAB_0011e337;
      s = (char *)((byte *)s + 1);
      goto LAB_0011e0a1;
    }
    if (!bVar10) goto LAB_0011e337;
    s = (char *)((byte *)s + 1);
  }
  pbVar6 = (byte *)max_expand(ms,s,pcVar9,p);
  goto LAB_0011e354;
code_r0x0011e0d5:
  if (pcVar9[2] != '[') {
    lj_err_caller(ms->L,LJ_ERR_STRPATB);
  }
  p_00 = pcVar9 + 2;
  pcVar9 = classend(ms,p_00);
  if (s == ms->src_init) {
    uVar5 = 0;
  }
  else {
    uVar5 = (uint)((byte *)s)[-1];
  }
  iVar4 = matchbracketclass(uVar5,p_00,pcVar9 + -1);
  if ((iVar4 != 0) || (iVar4 = matchbracketclass((uint)(byte)*s,p_00,pcVar9 + -1), iVar4 == 0))
  goto LAB_0011e337;
  goto LAB_0011e0a8;
LAB_0011e1ef:
  if (ms->src_end <= s_00) goto LAB_0011e337;
  if (*s_00 == pcVar9[3]) {
    iVar4 = iVar4 + -1;
    if (iVar4 == 0) goto LAB_0011e244;
  }
  else {
    iVar4 = iVar4 + (uint)(*s_00 == bVar1);
  }
  s_00 = s_00 + 1;
  goto LAB_0011e1ef;
LAB_0011e244:
  s = (char *)(s_00 + 1);
  p = pcVar9 + 4;
  goto LAB_0011e0a1;
LAB_0011e337:
  pbVar6 = (byte *)0x0;
  goto LAB_0011e354;
  while( true ) {
    if (ms->src_end <= s) goto LAB_0011e337;
    iVar4 = singlematch((uint)(byte)*s,pcVar9,p);
    s = (char *)((byte *)s + 1);
    pbVar6 = (byte *)0x0;
    if (iVar4 == 0) break;
LAB_0011e386:
    pbVar6 = (byte *)match(ms,s,p + 1);
    if (pbVar6 != (byte *)0x0) break;
  }
LAB_0011e354:
  ms->depth = ms->depth + -1;
  return (char *)pbVar6;
}

Assistant:

static const char *match(MatchState *ms, const char *s, const char *p)
{
  if (++ms->depth > LJ_MAX_XLEVEL)
    lj_err_caller(ms->L, LJ_ERR_STRPATX);
  init: /* using goto's to optimize tail recursion */
  switch (*p) {
  case '(':  /* start capture */
    if (*(p+1) == ')')  /* position capture? */
      s = start_capture(ms, s, p+2, CAP_POSITION);
    else
      s = start_capture(ms, s, p+1, CAP_UNFINISHED);
    break;
  case ')':  /* end capture */
    s = end_capture(ms, s, p+1);
    break;
  case L_ESC:
    switch (*(p+1)) {
    case 'b':  /* balanced string? */
      s = matchbalance(ms, s, p+2);
      if (s == NULL) break;
      p+=4;
      goto init;  /* else s = match(ms, s, p+4); */
    case 'f': {  /* frontier? */
      const char *ep; char previous;
      p += 2;
      if (*p != '[')
	lj_err_caller(ms->L, LJ_ERR_STRPATB);
      ep = classend(ms, p);  /* points to what is next */
      previous = (s == ms->src_init) ? '\0' : *(s-1);
      if (matchbracketclass(uchar(previous), p, ep-1) ||
	 !matchbracketclass(uchar(*s), p, ep-1)) { s = NULL; break; }
      p=ep;
      goto init;  /* else s = match(ms, s, ep); */
      }
    default:
      if (lj_char_isdigit(uchar(*(p+1)))) {  /* capture results (%0-%9)? */
	s = match_capture(ms, s, uchar(*(p+1)));
	if (s == NULL) break;
	p+=2;
	goto init;  /* else s = match(ms, s, p+2) */
      }
      goto dflt;  /* case default */
    }
    break;
  case '\0':  /* end of pattern */
    break;  /* match succeeded */
  case '$':
    /* is the `$' the last char in pattern? */
    if (*(p+1) != '\0') goto dflt;
    if (s != ms->src_end) s = NULL;  /* check end of string */
    break;
  default: dflt: {  /* it is a pattern item */
    const char *ep = classend(ms, p);  /* points to what is next */
    int m = s<ms->src_end && singlematch(uchar(*s), p, ep);
    switch (*ep) {
    case '?': {  /* optional */
      const char *res;
      if (m && ((res=match(ms, s+1, ep+1)) != NULL)) {
	s = res;
	break;
      }
      p=ep+1;
      goto init;  /* else s = match(ms, s, ep+1); */
      }
    case '*':  /* 0 or more repetitions */
      s = max_expand(ms, s, p, ep);
      break;
    case '+':  /* 1 or more repetitions */
      s = (m ? max_expand(ms, s+1, p, ep) : NULL);
      break;
    case '-':  /* 0 or more repetitions (minimum) */
      s = min_expand(ms, s, p, ep);
      break;
    default:
      if (m) { s++; p=ep; goto init; }  /* else s = match(ms, s+1, ep); */
      s = NULL;
      break;
    }
    break;
    }
  }
  ms->depth--;
  return s;
}